

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  Descriptor *pDVar1;
  _func_void_FieldDescriptor_ptr *local_20;
  FieldDescriptor *local_18;
  
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_20 = TypeOnceInit;
    local_18 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),&local_20,&local_18);
  }
  if (this[2] == (FieldDescriptor)0xe) {
    pDVar1 = (Descriptor *)enum_type(this);
  }
  else {
    if (this[2] != (FieldDescriptor)0xb) {
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_20 = TypeOnceInit;
        local_18 = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x18),&local_20,&local_18);
      }
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,*(char **)(kTypeToName + (ulong)(byte)this[2] * 8)
                 ,(allocator *)&local_20);
      return __return_storage_ptr__;
    }
    pDVar1 = message_type(this);
  }
  std::operator+(__return_storage_ptr__,".",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(pDVar1 + 8) + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
      return "." + message_type()->full_name();
    case TYPE_ENUM:
      return "." + enum_type()->full_name();
    default:
      return kTypeToName[type()];
  }
}